

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

sector_t_conflict * __thiscall
sector_t::FindModelFloorSector(sector_t_conflict *this,double floordestheight)

{
  double dVar1;
  line_t_conflict *plVar2;
  double dVar3;
  double dVar4;
  sector_t_conflict *psVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  if (0 < (long)this->linecount) {
    lVar6 = 0;
    do {
      plVar2 = this->lines[lVar6];
      if (((plVar2->flags & 4) != 0) &&
         (((psVar5 = plVar2->frontsector, psVar5 != this ||
           (psVar5 = plVar2->backsector, psVar5 != this)) && (psVar5 != (sector_t_conflict *)0x0))))
      {
        dVar1 = (psVar5->floorplane).D;
        dVar3 = (psVar5->floorplane).normal.X;
        dVar4 = (psVar5->floorplane).normal.Y;
        dVar7 = (psVar5->floorplane).negiC;
        dVar8 = ((plVar2->v1->p).Y * dVar4 + dVar1 + (plVar2->v1->p).X * dVar3) * dVar7;
        if ((dVar8 == floordestheight) && (!NAN(dVar8) && !NAN(floordestheight))) {
          return psVar5;
        }
        dVar7 = dVar7 * (dVar4 * (plVar2->v2->p).Y + dVar1 + dVar3 * (plVar2->v2->p).X);
        if ((dVar7 == floordestheight) && (!NAN(dVar7) && !NAN(floordestheight))) {
          return psVar5;
        }
      }
      lVar6 = lVar6 + 1;
    } while (this->linecount != lVar6);
  }
  return (sector_t_conflict *)0x0;
}

Assistant:

sector_t *sector_t::FindModelFloorSector (double floordestheight) const
{
	int i;
	sector_t *sec;

	//jff 5/23/98 don't disturb sec->linecount while searching
	// but allow early exit in old demos
	for (i = 0; i < linecount; i++)
	{
		sec = getNextSector (lines[i], this);
		if (sec != NULL &&
			(sec->floorplane.ZatPoint(lines[i]->v1) == floordestheight ||
			 sec->floorplane.ZatPoint(lines[i]->v2) == floordestheight))
		{
			return sec;
		}
	}
	return NULL;
}